

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrace-alloc.cc
# Opt level: O0

void resize_to(backtrace_state *state,size_t new_size,backtrace_vector *vec)

{
  void *__dest;
  void *base;
  backtrace_vector *vec_local;
  size_t new_size_local;
  backtrace_state *state_local;
  
  __dest = tcmalloc_backtrace_alloc(state,new_size,(backtrace_error_callback)0x0,(void *)0x0);
  memcpy(__dest,vec->base,vec->size);
  tcmalloc_backtrace_free(state,vec->base,vec->alc,(backtrace_error_callback)0x0,(void *)0x0);
  vec->base = __dest;
  vec->alc = new_size - vec->size;
  return;
}

Assistant:

static void resize_to(struct backtrace_state *state,
                      size_t new_size,
                      struct backtrace_vector *vec) {
  void *base = tcmalloc_backtrace_alloc(state, new_size, nullptr, nullptr);
  memcpy(base, vec->base, vec->size);
  tcmalloc_backtrace_free(state, vec->base, vec->alc, nullptr, nullptr);

  vec->base = base;
  vec->alc = new_size - vec->size;
}